

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucln_in.cpp
# Opt level: O0

UBool i18n_cleanup(void)

{
  int local_c;
  int32_t libType;
  
  local_c = -1;
  while (local_c = local_c + 1, local_c < 0x22) {
    if (gCleanupFunctions[local_c] != (cleanupFunc *)0x0) {
      (*gCleanupFunctions[local_c])();
      gCleanupFunctions[local_c] = (cleanupFunc *)0x0;
    }
  }
  return '\x01';
}

Assistant:

static UBool U_CALLCONV i18n_cleanup(void)
{
    int32_t libType = UCLN_I18N_START;
    (void)copyright;   /* Suppress unused variable warning with clang. */

    while (++libType<UCLN_I18N_COUNT) {
        if (gCleanupFunctions[libType])
        {
            gCleanupFunctions[libType]();
            gCleanupFunctions[libType] = NULL;
        }
    }
#if !UCLN_NO_AUTO_CLEANUP && (defined(UCLN_AUTO_ATEXIT) || defined(UCLN_AUTO_LOCAL))
    ucln_unRegisterAutomaticCleanup();
#endif
    return TRUE;
}